

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_plte(spng_ctx *ctx,spng_plte *plte)

{
  int iVar1;
  int ret;
  spng_plte *plte_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (plte == (spng_plte *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->data == (uchar *)0x0) && ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0)) {
    ctx_local._4_4_ = 0x52;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      if (((uint)ctx->stored & 1) == 0) {
        ctx_local._4_4_ = 1;
      }
      else {
        iVar1 = check_plte(plte,&ctx->ihdr);
        if (iVar1 == 0) {
          (ctx->plte).n_entries = plte->n_entries;
          memcpy((ctx->plte).entries,plte->entries,(ulong)plte->n_entries << 2);
          ctx->stored = (spng_chunk_bitfield)((uint)ctx->stored & 0xfffffffd | 2);
          ctx->user = (spng_chunk_bitfield)((uint)ctx->user & 0xfffffffd | 2);
          ctx_local._4_4_ = 0;
        }
        else {
          ctx_local._4_4_ = 1;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_plte(spng_ctx *ctx, struct spng_plte *plte)
{
    SPNG_SET_CHUNK_BOILERPLATE(plte);

    if(!ctx->stored.ihdr) return 1;

    if(check_plte(plte, &ctx->ihdr)) return 1;

    ctx->plte.n_entries = plte->n_entries;

    memcpy(ctx->plte.entries, plte->entries, plte->n_entries * sizeof(struct spng_plte_entry));

    ctx->stored.plte = 1;
    ctx->user.plte = 1;

    return 0;
}